

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomHeap.h
# Opt level: O3

BVIndex __thiscall
Memory::CustomHeap::Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
GetFreeIndexForPage(Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper> *this,
                   Page *page,size_t bytes)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  UnitWord64 bits;
  uint uVar5;
  
  uVar5 = 1;
  if (0x80 < bytes) {
    uVar5 = (uint)(bytes >> 7) & 0x1ffffff;
  }
  uVar3 = (page->freeBitVector).word;
  if (uVar3 != 0) {
    uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar3 = (uVar3 & 0xf0f0f0f0f0f0f0f) << 4 | uVar3 >> 4 & 0xf0f0f0f0f0f0f0f;
    uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333) * 4;
    bits = (uVar3 >> 1 & 0x5555555555555555) + (uVar3 & 0x5555555555555555) * 2;
    iVar4 = 0;
    do {
      uVar1 = BVUnitT<unsigned_long>::NumLeadingZeroes(bits);
      uVar3 = bits << ((byte)uVar1 & 0x3f);
      uVar2 = BVUnitT<unsigned_long>::NumLeadingZeroes(~uVar3);
      if (uVar5 <= uVar2) {
        return iVar4 + uVar1;
      }
      bits = uVar3 << ((byte)uVar2 & 0x3f);
      iVar4 = iVar4 + uVar1 + uVar2;
    } while (bits != 0);
  }
  return 0xffffffff;
}

Assistant:

inline BVIndex GetFreeIndexForPage(Page* page, DECLSPEC_GUARD_OVERFLOW size_t bytes)
    {
        unsigned int length = GetChunkSizeForBytes(bytes);
        BVIndex index = page->freeBitVector.FirstStringOfOnes(length);

        return index;
    }